

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFPageObjectHelper::placeFormXObject
          (string *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          string *name,Rectangle rect,bool invert_transformations,bool allow_shrink,
          bool allow_expand)

{
  QPDFObjectHandle local_70;
  undefined1 local_60 [8];
  QPDFMatrix cm;
  bool allow_expand_local;
  bool allow_shrink_local;
  bool invert_transformations_local;
  string *name_local;
  QPDFObjectHandle *fo_local;
  QPDFPageObjectHelper *this_local;
  
  cm.f._5_1_ = allow_expand;
  cm.f._6_1_ = allow_shrink;
  cm.f._7_1_ = invert_transformations;
  QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_60);
  QPDFObjectHandle::QPDFObjectHandle(&local_70,fo);
  placeFormXObject(__return_storage_ptr__,this,&local_70,name,rect,(QPDFMatrix *)local_60,
                   (bool)(cm.f._7_1_ & 1),(bool)(cm.f._6_1_ & 1),(bool)(cm.f._5_1_ & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFPageObjectHelper::placeFormXObject(
    QPDFObjectHandle fo,
    std::string const& name,
    QPDFObjectHandle::Rectangle rect,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    QPDFMatrix cm;
    return placeFormXObject(fo, name, rect, cm, invert_transformations, allow_shrink, allow_expand);
}